

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argtable3.c
# Opt level: O3

int conv_num(char **buf,int *dest,int llim,int ulim)

{
  int iVar1;
  char *pcVar2;
  char *pcVar3;
  int rulim;
  int iVar4;
  int iVar5;
  
  if (0xf5 < (byte)(**buf - 0x3aU)) {
    iVar4 = 0;
    iVar5 = ulim;
    pcVar2 = *buf;
    do {
      pcVar3 = pcVar2 + 1;
      *buf = pcVar3;
      iVar1 = iVar4 * 10;
      iVar4 = (int)*pcVar2 + iVar4 * 10 + -0x30;
      if ((ulim < ((*pcVar2 + iVar1) * 2 + -0x60) * 5) || (0xffffffec < iVar5 - 10U)) break;
      iVar5 = iVar5 / 10;
      pcVar2 = pcVar3;
    } while ((byte)(*pcVar3 - 0x30U) < 10);
    if (iVar4 <= ulim && llim <= iVar4) {
      *dest = iVar4;
      return 1;
    }
  }
  return 0;
}

Assistant:

static int conv_num(const char * *buf, int * dest, int llim, int ulim) {
	int result = 0;

	/* The limit also determines the number of valid digits. */
	int rulim = ulim;

	if (**buf < '0' || ** buf > '9') {
		return (0);
	}

	do {
		result *= 10;
		result += *(*buf)++ - '0';
		rulim /= 10;
	} while ((result * 10 <= ulim) && rulim && ** buf >= '0' && ** buf <= '9');

	if (result < llim || result > ulim) {
		return (0);
	}

	*dest = result;
	return (1);
}